

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode multi_do_more(Curl_easy *data,int *complete)

{
  connectdata *pcVar1;
  connectdata *conn;
  CURLcode result;
  int *complete_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  *complete = 0;
  if (pcVar1->handler->do_more != (_func_CURLcode_Curl_easy_ptr_int_ptr *)0x0) {
    conn._4_4_ = (*pcVar1->handler->do_more)(data,complete);
  }
  return conn._4_4_;
}

Assistant:

static CURLcode multi_do_more(struct Curl_easy *data, int *complete)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  *complete = 0;

  if(conn->handler->do_more)
    result = conn->handler->do_more(data, complete);

  return result;
}